

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMesh::ComputeMassProperties
          (ChMesh *this,double *mass,ChVector<double> *com,ChMatrix33<double> *inertia)

{
  double dVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  uint uVar5;
  ChMatrix33<double> local_68;
  
  *mass = 0.0;
  com->m_data[2] = 0.0;
  com->m_data[0] = 0.0;
  com->m_data[1] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_68,1.0);
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  (inertia->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_68.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  psVar2 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar5 = 0; (ulong)uVar5 < (ulong)((long)psVar3 - (long)psVar2 >> 4); uVar5 = uVar5 + 1) {
    (psVar2[uVar5].super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    )->m_TotalMass = 0.0;
  }
  uVar5 = 0;
  while( true ) {
    psVar4 = (this->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->velements).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4) <=
        (ulong)uVar5) break;
    (*(psVar4[uVar5].super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_ChElementBase[8])();
    uVar5 = uVar5 + 1;
  }
  dVar1 = *mass;
  psVar2 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar5 = 0; (ulong)uVar5 < (ulong)((long)psVar3 - (long)psVar2 >> 4); uVar5 = uVar5 + 1) {
    dVar1 = dVar1 + (psVar2[uVar5].
                     super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_TotalMass;
    *mass = dVar1;
  }
  return;
}

Assistant:

void ChMesh::ComputeMassProperties(double& mass,           // ChMesh object mass
                                   ChVector<>& com,        // ChMesh center of gravity
                                   ChMatrix33<>& inertia)  // ChMesh inertia tensor
{
    mass = 0;
    com = ChVector<>(0);
    inertia = ChMatrix33<>(1);

    // Initialize all nodal total masses to zero
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        vnodes[j]->m_TotalMass = 0.0;
    }
    // Loop over all elements and calculate contribution to nodal mass
    for (unsigned int ie = 0; ie < velements.size(); ie++) {
        velements[ie]->ComputeNodalMass();
    }
    // Loop over all the nodes of the mesh to obtain total object mass
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        mass += vnodes[j]->m_TotalMass;
    }
}